

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::symms_inria2osh(Omega_h *this,Int dim,Reals *symms)

{
  void *extraout_RDX;
  Write<double> *this_00;
  Reals RVar1;
  Write<double> local_40;
  Write<double> local_30;
  Write<double> local_20;
  
  if (dim == 1) {
    this_00 = &local_40;
    Write<double>::Write(this_00,&symms->write_);
    symms_inria2osh_dim<1>(this,(Reals *)this_00);
  }
  else if (dim == 2) {
    this_00 = &local_30;
    Write<double>::Write(this_00,&symms->write_);
    symms_inria2osh_dim<2>(this,(Reals *)this_00);
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x6a);
    }
    this_00 = &local_20;
    Write<double>::Write(this_00,&symms->write_);
    symms_inria2osh_dim<3>(this,(Reals *)this_00);
  }
  Write<double>::~Write(this_00);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals symms_inria2osh(Int dim, Reals symms) {
  if (dim == 3) return symms_inria2osh_dim<3>(symms);
  if (dim == 2) return symms_inria2osh_dim<2>(symms);
  if (dim == 1) return symms_inria2osh_dim<1>(symms);
  OMEGA_H_NORETURN(Reals());
}